

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::addQualifierToExisting
          (HlslParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  bool bVar1;
  int iVar2;
  TSymbol *shared;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar3;
  undefined4 extraout_var_03;
  pointer pcVar4;
  char *pcVar5;
  ulong uVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  shared = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (shared == (TSymbol *)0x0) {
    pcVar4 = (identifier->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar5 = "identifier not previously declared";
  }
  else {
    iVar2 = (*shared->_vptr_TSymbol[7])(shared);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      if ((((CONCAT44(qualifier._12_4_,qualifier._8_4_) & 0x3fff1e0e0000000) != 0) ||
          (bVar1 = TQualifier::hasLayout(&qualifier), bVar1)) ||
         ((qualifier._8_4_ & 0xe00007f) != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
                   ,(identifier->_M_dataplus)._M_p,"");
        return;
      }
      iVar2 = (*shared->_vptr_TSymbol[0x14])(shared);
      if ((char)iVar2 != '\0') {
        shared = TSymbolTable::copyUp((this->super_TParseContextBase).symbolTable,shared);
      }
      if (((uint)qualifier._8_4_ >> 0x1c & 1) == 0) {
        if ((qualifier._12_4_ & 0x10) != 0) {
          bVar1 = TIntermediate::inIoAccessed
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             identifier);
          if (bVar1) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change qualification after use","precise","");
          }
          iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
          lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))
                            ((long *)CONCAT44(extraout_var_01,iVar2));
          *(ulong *)(lVar3 + 8) = *(ulong *)(lVar3 + 8) | 0x1000000000;
          return;
        }
        if ((qualifier._12_4_ & 1) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,loc,"unknown requalification","","");
          return;
        }
        iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar2));
        *(ulong *)(lVar3 + 8) = (*(ulong *)(lVar3 + 8) & 0xfffffffeffffff80) + 0x100000002;
        uVar6 = qualifier._36_8_ & 0x7ff0000000000;
        if (uVar6 == 0x7ff0000000000) {
          return;
        }
        iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                          ((long *)CONCAT44(extraout_var_03,iVar2));
        *(ulong *)(lVar3 + 0x24) = *(ulong *)(lVar3 + 0x24) & 0xfff800ffffffffff | uVar6;
        return;
      }
      bVar1 = TIntermediate::inIoAccessed
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         identifier);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change qualification after use","invariant","");
      }
      iVar2 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_00,iVar2));
      *(byte *)(lVar3 + 0xb) = *(byte *)(lVar3 + 0xb) | 0x10;
      return;
    }
    pcVar4 = (identifier->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar5 = "cannot re-qualify a function name";
  }
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,pcVar4,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);
    if (symbol == nullptr) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
    } else if (qualifier.noContraction) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().noContraction = true;
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}